

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClassMethodPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassMethodPrototypeSyntax,slang::syntax::ClassMethodPrototypeSyntax_const&>
          (BumpAllocator *this,ClassMethodPrototypeSyntax *args)

{
  ClassMethodPrototypeSyntax *pCVar1;
  ClassMethodPrototypeSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pCVar1 = (ClassMethodPrototypeSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ClassMethodPrototypeSyntax::ClassMethodPrototypeSyntax(in_RSI,pCVar1);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }